

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O2

void SET_OF_free(asn_TYPE_descriptor_t *td,void *ptr,int contents_only)

{
  asn_TYPE_member_s *paVar1;
  void *pvVar2;
  asn_TYPE_descriptor_s *paVar3;
  long lVar4;
  
  if (ptr != (void *)0x0 && td != (asn_TYPE_descriptor_t *)0x0) {
    paVar1 = td->elements;
    for (lVar4 = 0; lVar4 < *(int *)((long)ptr + 8); lVar4 = lVar4 + 1) {
      pvVar2 = *(void **)(*ptr + lVar4 * 8);
      if (pvVar2 != (void *)0x0) {
        paVar3 = paVar1->type;
        (*paVar3->free_struct)(paVar3,pvVar2,0);
      }
    }
    *(undefined4 *)((long)ptr + 8) = 0;
    asn_set_empty(ptr);
    lVar4 = (long)*(int *)((long)td->specifics + 4);
    pvVar2 = *(void **)((long)ptr + lVar4 + 8);
    if (pvVar2 != (void *)0x0) {
      paVar3 = paVar1->type;
      (*paVar3->free_struct)(paVar3,pvVar2,0);
      *(undefined8 *)((long)ptr + lVar4 + 8) = 0;
    }
    if (contents_only == 0) {
      free(ptr);
      return;
    }
  }
  return;
}

Assistant:

void
SET_OF_free(asn_TYPE_descriptor_t *td, void *ptr, int contents_only) {
	if(td && ptr) {
		asn_SET_OF_specifics_t *specs;
		asn_TYPE_member_t *elm = td->elements;
		asn_anonymous_set_ *list = _A_SET_FROM_VOID(ptr);
		asn_struct_ctx_t *ctx;	/* Decoder context */
		int i;

		/*
		 * Could not use set_of_empty() because of (*free)
		 * incompatibility.
		 */
		for(i = 0; i < list->count; i++) {
			void *memb_ptr = list->array[i];
			if(memb_ptr)
			ASN_STRUCT_FREE(*elm->type, memb_ptr);
		}
		list->count = 0;	/* No meaningful elements left */

		asn_set_empty(list);	/* Remove (list->array) */

		specs = (asn_SET_OF_specifics_t *)td->specifics;
		ctx = (asn_struct_ctx_t *)((char *)ptr + specs->ctx_offset);
		if(ctx->ptr) {
			ASN_STRUCT_FREE(*elm->type, ctx->ptr);
			ctx->ptr = 0;
		}

		if(!contents_only) {
			FREEMEM(ptr);
		}
	}
}